

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

void __thiscall EmmyFacade::InitReq(EmmyFacade *this,InitParams *params)

{
  bool bVar1;
  InitParams *params_local;
  EmmyFacade *this_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)this);
  if (bVar1) {
    std::function<void_()>::operator()(&this->StartHook);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->_emmyDebuggerManager).helperCode,(string *)&params->emmyHelper);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->_emmyDebuggerManager).extNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->_emmyDebuggerManager).extNames,&params->ext);
  StartDebug(this);
  return;
}

Assistant:

void EmmyFacade::InitReq(InitParams & params) {
	if (StartHook) {
		StartHook();
	}

	_emmyDebuggerManager.helperCode = params.emmyHelper;
	_emmyDebuggerManager.extNames.clear();
	_emmyDebuggerManager.extNames = params.ext;

	// 这里有个线程安全问题，消息线程和lua 执行线程不是相同线程，但是没有一个锁能让我做同步
	// 所以我不能在这里访问lua state 指针的内部结构
	//
	// 方案：提前为主state 设置hook 利用hook 实现同步

	// fix 以上安全问题
	StartDebug();
}